

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void lz77_compress(LZ77Context *ctx,uchar *data,int len)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  LZ77InternalContext *st_00;
  int iVar5;
  int local_15c;
  int j_1;
  int hash;
  int j;
  int iStack_148;
  uchar foo [3];
  int deferchr;
  Match matches [32];
  Match defermatch;
  int advance;
  int matchlen;
  int nmatch;
  int off;
  int distance;
  int i;
  LZ77InternalContext *st;
  byte *pbStack_18;
  int len_local;
  uchar *data_local;
  LZ77Context *ctx_local;
  
  st_00 = ctx->ictx;
  if (3 < st_00->npending) {
    __assert_fail("st->npending <= HASHCHARS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0xba,"void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
  }
  off = 0;
  while( true ) {
    if (st_00->npending <= off) goto LAB_001496ca;
    if ((len + st_00->npending) - off < 3) break;
    for (j_1 = 0; uVar1 = hash._1_1_, j_1 < 3; j_1 = j_1 + 1) {
      if (off + j_1 < st_00->npending) {
        uVar1 = st_00->pending[off + j_1];
      }
      else {
        uVar1 = data[(off + j_1) - st_00->npending];
      }
      *(uchar *)((long)&hash + (long)j_1 + 1) = uVar1;
    }
    iVar5 = lz77_hash((uchar *)((long)&hash + 1));
    lz77_advance(st_00,uVar1,iVar5);
    off = off + 1;
  }
  for (j_1 = off; j_1 < st_00->npending; j_1 = j_1 + 1) {
    st_00->pending[j_1 - off] = st_00->pending[j_1];
  }
LAB_001496ca:
  st_00->npending = st_00->npending - off;
  matches[0x1f].distance = 0;
  matches[0x1f].len = 0;
  j = 0;
  st._4_4_ = len;
  pbStack_18 = data;
  do {
    if (st._4_4_ < 1) {
      return;
    }
    if (st._4_4_ < 3) {
      advance = 0;
    }
    else {
      iVar5 = lz77_hash(pbStack_18);
      advance = 0;
      sVar4 = st_00->hashtab[iVar5].first;
      while (matchlen = (int)sVar4, matchlen != -1) {
        iVar5 = 0x8000 - ((matchlen + 0x8000) - st_00->winpos) % 0x8000;
        for (off = 0; off < 3; off = off + 1) {
          if (off < 0) {
            bVar2 = st_00->data[(int)(st_00->winpos + off & 0x7fff)];
          }
          else {
            bVar2 = pbStack_18[off];
          }
          if (off - iVar5 < 0) {
            bVar3 = st_00->data[(int)((st_00->winpos + off) - iVar5 & 0x7fff)];
          }
          else {
            bVar3 = pbStack_18[off - iVar5];
          }
          if (bVar2 != bVar3) break;
        }
        if (off == 3) {
          matches[(long)advance + -1].distance = iVar5;
          matches[(long)advance + -1].len = 3;
          advance = advance + 1;
          if (0x1f < advance) break;
        }
        sVar4 = st_00->win[matchlen].next;
      }
    }
    if (advance < 1) {
      if (matches[0x1f].len < 1) {
        (*ctx->literal)(ctx,*pbStack_18);
        defermatch.distance = 1;
      }
      else {
        (*ctx->match)(ctx,matches[0x1f].distance,matches[0x1f].len);
        defermatch.distance = matches[0x1f].len + -1;
        matches[0x1f] = (Match)((ulong)matches[0x1f] & 0xffffffff);
      }
    }
    else {
      for (defermatch.len = 3; defermatch.len < st._4_4_; defermatch.len = defermatch.len + 1) {
        local_15c = 0;
        for (off = 0; off < advance; off = off + 1) {
          if (defermatch.len < 0) {
            bVar2 = st_00->data[(int)(st_00->winpos + defermatch.len & 0x7fff)];
          }
          else {
            bVar2 = pbStack_18[defermatch.len];
          }
          if (defermatch.len - matches[(long)off + -1].distance < 0) {
            bVar3 = st_00->data
                    [(int)((st_00->winpos + defermatch.len) - matches[(long)off + -1].distance &
                          0x7fff)];
          }
          else {
            bVar3 = pbStack_18[defermatch.len - matches[(long)off + -1].distance];
          }
          if (bVar2 == bVar3) {
            matches[(long)local_15c + -1] = matches[(long)off + -1];
            local_15c = local_15c + 1;
          }
        }
        if (local_15c == 0) break;
        advance = local_15c;
      }
      if (matches[0x1f].len < 1) {
        matches[0x1f].len = defermatch.len;
        matches[0x1f].distance = iStack_148;
        j = (int)*pbStack_18;
        defermatch.distance = 1;
      }
      else if (matches[0x1f].len + 1 < defermatch.len) {
        (*ctx->literal)(ctx,(uchar)j);
        matches[0x1f].len = defermatch.len;
        matches[0x1f].distance = iStack_148;
        j = (int)*pbStack_18;
        defermatch.distance = 1;
      }
      else {
        (*ctx->match)(ctx,matches[0x1f].distance,matches[0x1f].len);
        defermatch.distance = matches[0x1f].len + -1;
        matches[0x1f] = (Match)((ulong)matches[0x1f] & 0xffffffff);
      }
    }
    for (; 0 < defermatch.distance; defermatch.distance = defermatch.distance + -1) {
      if (st._4_4_ < 3) {
        if (2 < st_00->npending) {
          __assert_fail("st->npending < HASHCHARS",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                        ,0x140,
                        "void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
        }
        bVar2 = *pbStack_18;
        iVar5 = st_00->npending;
        st_00->npending = iVar5 + 1;
        st_00->pending[iVar5] = bVar2;
      }
      else {
        bVar2 = *pbStack_18;
        iVar5 = lz77_hash(pbStack_18);
        lz77_advance(st_00,bVar2,iVar5);
      }
      pbStack_18 = pbStack_18 + 1;
      st._4_4_ = st._4_4_ + -1;
    }
  } while( true );
}

Assistant:

static void lz77_compress(struct LZ77Context *ctx,
                          const unsigned char *data, int len)
{
    struct LZ77InternalContext *st = ctx->ictx;
    int i, distance, off, nmatch, matchlen, advance;
    struct Match defermatch, matches[MAXMATCH];
    int deferchr;

    assert(st->npending <= HASHCHARS);

    /*
     * Add any pending characters from last time to the window. (We
     * might not be able to.)
     *
     * This leaves st->pending empty in the usual case (when len >=
     * HASHCHARS); otherwise it leaves st->pending empty enough that
     * adding all the remaining 'len' characters will not push it past
     * HASHCHARS in size.
     */
    for (i = 0; i < st->npending; i++) {
        unsigned char foo[HASHCHARS];
        int j;
        if (len + st->npending - i < HASHCHARS) {
            /* Update the pending array. */
            for (j = i; j < st->npending; j++)
                st->pending[j - i] = st->pending[j];
            break;
        }
        for (j = 0; j < HASHCHARS; j++)
            foo[j] = (i + j < st->npending ? st->pending[i + j] :
                      data[i + j - st->npending]);
        lz77_advance(st, foo[0], lz77_hash(foo));
    }
    st->npending -= i;

    defermatch.distance = 0; /* appease compiler */
    defermatch.len = 0;
    deferchr = '\0';
    while (len > 0) {

        if (len >= HASHCHARS) {
            /*
             * Hash the next few characters.
             */
            int hash = lz77_hash(data);

            /*
             * Look the hash up in the corresponding hash chain and see
             * what we can find.
             */
            nmatch = 0;
            for (off = st->hashtab[hash].first;
                 off != INVALID; off = st->win[off].next) {
                /* distance = 1       if off == st->winpos-1 */
                /* distance = WINSIZE if off == st->winpos   */
                distance =
                    WINSIZE - (off + WINSIZE - st->winpos) % WINSIZE;
                for (i = 0; i < HASHCHARS; i++)
                    if (CHARAT(i) != CHARAT(i - distance))
                        break;
                if (i == HASHCHARS) {
                    matches[nmatch].distance = distance;
                    matches[nmatch].len = 3;
                    if (++nmatch >= MAXMATCH)
                        break;
                }
            }
        } else {
            nmatch = 0;
        }

        if (nmatch > 0) {
            /*
             * We've now filled up matches[] with nmatch potential
             * matches. Follow them down to find the longest. (We
             * assume here that it's always worth favouring a
             * longer match over a shorter one.)
             */
            matchlen = HASHCHARS;
            while (matchlen < len) {
                int j;
                for (i = j = 0; i < nmatch; i++) {
                    if (CHARAT(matchlen) ==
                        CHARAT(matchlen - matches[i].distance)) {
                        matches[j++] = matches[i];
                    }
                }
                if (j == 0)
                    break;
                matchlen++;
                nmatch = j;
            }

            /*
             * We've now got all the longest matches. We favour the
             * shorter distances, which means we go with matches[0].
             * So see if we want to defer it or throw it away.
             */
            matches[0].len = matchlen;
            if (defermatch.len > 0) {
                if (matches[0].len > defermatch.len + 1) {
                    /* We have a better match. Emit the deferred char,
                     * and defer this match. */
                    ctx->literal(ctx, (unsigned char) deferchr);
                    defermatch = matches[0];
                    deferchr = data[0];
                    advance = 1;
                } else {
                    /* We don't have a better match. Do the deferred one. */
                    ctx->match(ctx, defermatch.distance, defermatch.len);
                    advance = defermatch.len - 1;
                    defermatch.len = 0;
                }
            } else {
                /* There was no deferred match. Defer this one. */
                defermatch = matches[0];
                deferchr = data[0];
                advance = 1;
            }
        } else {
            /*
             * We found no matches. Emit the deferred match, if
             * any; otherwise emit a literal.
             */
            if (defermatch.len > 0) {
                ctx->match(ctx, defermatch.distance, defermatch.len);
                advance = defermatch.len - 1;
                defermatch.len = 0;
            } else {
                ctx->literal(ctx, data[0]);
                advance = 1;
            }
        }

        /*
         * Now advance the position by `advance' characters,
         * keeping the window and hash chains consistent.
         */
        while (advance > 0) {
            if (len >= HASHCHARS) {
                lz77_advance(st, *data, lz77_hash(data));
            } else {
                assert(st->npending < HASHCHARS);
                st->pending[st->npending++] = *data;
            }
            data++;
            len--;
            advance--;
        }
    }
}